

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O3

void __thiscall QSQLiteResultPrivate::cleanup(QSQLiteResultPrivate *this,EVP_PKEY_CTX *ctx)

{
  long *plVar1;
  
  plVar1 = *(long **)&(this->super_QSqlCachedResultPrivate).field_0x8;
  if (this->stmt != (sqlite3_stmt *)0x0) {
    sqlite3_finalize(this->stmt);
    this->stmt = (sqlite3_stmt *)0x0;
  }
  QSqlRecord::clear();
  this->skippedStatus = false;
  this->skipRow = false;
  (**(code **)(*plVar1 + 0x18))(plVar1,0xffffffff);
  (**(code **)(*plVar1 + 0x20))(plVar1,0);
  QSqlCachedResult::cleanup();
  return;
}

Assistant:

void QSQLiteResultPrivate::cleanup()
{
    Q_Q(QSQLiteResult);
    finalize();
    rInf.clear();
    skippedStatus = false;
    skipRow = false;
    q->setAt(QSql::BeforeFirstRow);
    q->setActive(false);
    q->cleanup();
}